

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O3

void LenPriceEnc_UpdateTable(CLenPriceEnc *p,UInt32 posState,UInt32 *ProbPrices)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  
  uVar1 = p->tableSize;
  uVar5 = (ulong)uVar1;
  uVar6 = (p->p).choice >> 2 & 0xfffffffc;
  iVar9 = *(int *)((long)ProbPrices + (ulong)uVar6);
  iVar2 = *(int *)((long)ProbPrices + (ulong)(uVar6 ^ 0x1fc));
  uVar6 = (p->p).choice2 >> 2 & 0xfffffffc;
  iVar3 = *(int *)((long)ProbPrices + (ulong)uVar6);
  iVar4 = *(int *)((long)ProbPrices + (ulong)(uVar6 ^ 0x1fc));
  uVar6 = 7;
  if (uVar1 < 7) {
    uVar6 = uVar1;
  }
  uVar11 = 7;
  if (uVar5 < 7) {
    uVar11 = uVar5;
  }
  uVar11 = uVar11 + 1;
  uVar10 = 0;
  uVar6 = 0x10 - uVar6;
  do {
    uVar8 = uVar6;
    if (uVar10 == uVar5) goto LAB_0011396a;
    iVar12 = 0;
    uVar6 = (uint)uVar10 | 8;
    do {
      uVar7 = uVar6 >> 1;
      iVar12 = iVar12 + ProbPrices
                        [(-(uVar6 & 1) & 0x7f0 ^
                         (uint)*(ushort *)
                                ((long)(p->p).low +
                                (ulong)(uVar6 & 0xfffffffe) + (ulong)(posState << 3) * 2)) >> 4];
      uVar6 = uVar7;
    } while (uVar7 != 1);
    p->prices[posState][uVar10] = iVar12 + iVar9;
    uVar10 = uVar10 + 1;
    uVar6 = uVar8 + 1;
  } while (uVar10 != 8);
  uVar10 = (ulong)uVar8;
  do {
    if (uVar5 <= uVar11) goto LAB_0011396a;
    iVar9 = 0;
    uVar6 = (int)uVar11 - 8U | 8;
    do {
      uVar7 = uVar6 >> 1;
      iVar9 = iVar9 + ProbPrices
                      [(-(uVar6 & 1) & 0x7f0 ^
                       (uint)*(ushort *)
                              ((long)(p->p).mid +
                              (ulong)(uVar6 & 0xfffffffe) + (ulong)(posState << 3) * 2)) >> 4];
      uVar6 = uVar7;
    } while (uVar7 != 1);
    p->prices[posState][uVar11] = iVar9 + iVar3 + iVar2;
    uVar11 = uVar11 + 1;
  } while (uVar11 != uVar10);
  if (uVar8 < uVar1) {
    do {
      iVar9 = 0;
      uVar6 = (int)uVar10 - 0x10U | 0x100;
      do {
        uVar8 = uVar6 >> 1;
        iVar9 = iVar9 + ProbPrices
                        [(-(uVar6 & 1) & 0x7f0 ^
                         (uint)*(ushort *)((long)(p->p).high + (ulong)(uVar6 & 0xfffffffe))) >> 4];
        uVar6 = uVar8;
      } while (uVar8 != 1);
      p->prices[posState][uVar10] = iVar9 + iVar2 + iVar4;
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar5);
  }
LAB_0011396a:
  p->counters[posState] = uVar1;
  return;
}

Assistant:

static void MY_FAST_CALL LenPriceEnc_UpdateTable(CLenPriceEnc *p, UInt32 posState, const UInt32 *ProbPrices)
{
  LenEnc_SetPrices(&p->p, posState, p->tableSize, p->prices[posState], ProbPrices);
  p->counters[posState] = p->tableSize;
}